

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

int glfwGetOSMesaDepthBuffer
              (GLFWwindow *handle,int *width,int *height,int *bytesPerValue,void **buffer)

{
  int iVar1;
  _GLFWwindow *window;
  int local_48;
  GLint mesaBytes;
  GLint mesaHeight;
  GLint mesaWidth;
  void *mesaBuffer;
  void **buffer_local;
  int *bytesPerValue_local;
  int *height_local;
  int *width_local;
  GLFWwindow *handle_local;
  
  mesaBuffer = buffer;
  buffer_local = (void **)bytesPerValue;
  bytesPerValue_local = height;
  height_local = width;
  width_local = (int *)handle;
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      handle_local._4_4_ = 0;
    }
    else if (*(int *)(handle + 0x214) == 0x36003) {
      iVar1 = (*_glfw.osmesa.GetDepthBuffer)
                        (*(OSMesaContext *)(handle + 0x2a8),&mesaBytes,&local_48,
                         (int *)((long)&window + 4),(void **)&mesaHeight);
      if (iVar1 == 0) {
        _glfwInputError(0x10008,"OSMesa: Failed to retrieve depth buffer");
        handle_local._4_4_ = 0;
      }
      else {
        if (height_local != (int *)0x0) {
          *height_local = mesaBytes;
        }
        if (bytesPerValue_local != (int *)0x0) {
          *bytesPerValue_local = local_48;
        }
        if (buffer_local != (void **)0x0) {
          *(undefined4 *)buffer_local = window._4_4_;
        }
        if (mesaBuffer != (void *)0x0) {
          *(void **)mesaBuffer = _mesaHeight;
        }
        handle_local._4_4_ = 1;
      }
    }
    else {
      _glfwInputError(0x1000a,(char *)0x0);
      handle_local._4_4_ = 0;
    }
    return handle_local._4_4_;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/osmesa_context.c"
                ,0x153,"int glfwGetOSMesaDepthBuffer(GLFWwindow *, int *, int *, int *, void **)");
}

Assistant:

GLFWAPI int glfwGetOSMesaDepthBuffer(GLFWwindow* handle,
                                     int* width, int* height,
                                     int* bytesPerValue,
                                     void** buffer)
{
    void* mesaBuffer;
    GLint mesaWidth, mesaHeight, mesaBytes;
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (window->context.source != GLFW_OSMESA_CONTEXT_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return GLFW_FALSE;
    }

    if (!OSMesaGetDepthBuffer(window->context.osmesa.handle,
                              &mesaWidth, &mesaHeight,
                              &mesaBytes, &mesaBuffer))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "OSMesa: Failed to retrieve depth buffer");
        return GLFW_FALSE;
    }

    if (width)
        *width = mesaWidth;
    if (height)
        *height = mesaHeight;
    if (bytesPerValue)
        *bytesPerValue = mesaBytes;
    if (buffer)
        *buffer = mesaBuffer;

    return GLFW_TRUE;
}